

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

int Cec_ManLoadCounterExamples(Vec_Ptr_t *vInfo,Vec_Int_t *vCexStore,int iStart)

{
  int nWords;
  int iVar1;
  Vec_Int_t *p;
  Vec_Ptr_t *vPres;
  void *__s;
  int iVar2;
  bool bVar3;
  
  nWords = Vec_PtrReadWordsSimInfo(vInfo);
  p = Vec_IntAlloc(100);
  vPres = Vec_PtrAllocSimInfo(vInfo->nSize,nWords);
  iVar2 = 0;
  iVar1 = vPres->nSize;
  if (vPres->nSize < 1) {
    iVar1 = iVar2;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    __s = Vec_PtrEntry(vPres,iVar2);
    memset(__s,0,(long)(nWords * 4));
  }
  do {
    do {
      if (vCexStore->nSize <= iStart) goto LAB_0051b43b;
      iVar1 = iStart + 1;
      iStart = iStart + 2;
      iVar1 = Vec_IntEntry(vCexStore,iVar1);
    } while (iVar1 < 1);
    p->nSize = 0;
    while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
      iVar2 = Vec_IntEntry(vCexStore,iStart);
      Vec_IntPush(p,iVar2);
      iStart = iStart + 1;
    }
    for (iVar1 = 1; SBORROW4(iVar1,nWords * 0x20) != iVar1 + nWords * -0x20 < 0; iVar1 = iVar1 + 1)
    {
      iVar2 = Cec_ManLoadCounterExamplesTry(vInfo,vPres,iVar1,p->pArray,p->nSize);
      if (iVar2 != 0) break;
    }
  } while (iVar1 + nWords * -0x20 + 2 != 1);
LAB_0051b43b:
  Vec_PtrFree(vPres);
  Vec_IntFree(p);
  return iStart;
}

Assistant:

int Cec_ManLoadCounterExamples( Vec_Ptr_t * vInfo, Vec_Int_t * vCexStore, int iStart )
{ 
    Vec_Int_t * vPat;
    Vec_Ptr_t * vPres;
    int nWords = Vec_PtrReadWordsSimInfo(vInfo);
    int nBits = 32 * nWords; 
    int k, nSize, kMax = 0;//, iBit = 1;
    vPat  = Vec_IntAlloc( 100 );
    vPres = Vec_PtrAllocSimInfo( Vec_PtrSize(vInfo), nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++ )
            if ( Cec_ManLoadCounterExamplesTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
            break;
    }
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return iStart;
}